

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

int thitmonst(monst *mon,obj *obj,obj *ostack)

{
  char cVar1;
  boolean bVar2;
  schar sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  monst *pmVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  uint local_98;
  uint local_90;
  int local_58;
  bool local_49;
  int was_swallowed;
  int chance;
  int broken;
  schar dy;
  schar dx;
  boolean next2u;
  boolean obj_disint;
  boolean guaranteed_hit;
  int otyp;
  int disttmp;
  int tmp;
  obj *ostack_local;
  obj *obj_local;
  monst *mon_local;
  
  iVar4 = (int)obj->otyp;
  bVar12 = (u._1052_1_ & 1) != 0;
  bVar13 = mon == u.ustuck;
  local_49 = bVar12 && bVar13;
  bVar14 = false;
  if (((mon->data == mons + 0xdb) && (bVar14 = false, (*(uint *)&mon->field_0x60 >> 8 & 1) == 0)) &&
     (bVar14 = false, 1 < mon->mhp)) {
    bVar14 = true;
    if (objects[obj->otyp].oc_oprop != '\x04') {
      bVar2 = obj_resists(obj,5,0x32);
      bVar14 = true;
      if (bVar2 == '\0') {
        bVar2 = is_quest_artifact(obj);
        bVar14 = bVar2 != '\0';
      }
    }
    bVar14 = (bool)(bVar14 ^ 1);
  }
  iVar5 = (int)u.uluck;
  iVar11 = (int)u.moreluck;
  iVar6 = find_mac(mon);
  if (u.umonnum == u.umonster) {
    local_58 = u.ulevel;
  }
  else {
    local_58 = (int)(youmonst.data)->mlevel;
  }
  otyp = (iVar5 + iVar11) / 3 + -1 + iVar6 + (int)u.uhitinc + local_58;
  sVar3 = acurr(3);
  if (sVar3 < '\x04') {
    otyp = otyp + -3;
  }
  else {
    sVar3 = acurr(3);
    if (sVar3 < '\x06') {
      otyp = otyp + -2;
    }
    else {
      sVar3 = acurr(3);
      if (sVar3 < '\b') {
        otyp = otyp + -1;
      }
      else {
        sVar3 = acurr(3);
        if ('\r' < sVar3) {
          sVar3 = acurr(3);
          otyp = sVar3 + -0xe + otyp;
        }
      }
    }
  }
  _dx = distmin((int)u.ux,(int)u.uy,(int)mon->mx,(int)mon->my);
  _dx = 3 - _dx;
  if (_dx < -4) {
    _dx = -4;
  }
  otyp = _dx + otyp;
  if (((uarmg != (obj *)0x0) && (uwep != (obj *)0x0)) && (objects[uwep->otyp].oc_subtyp == '\x16'))
  {
    switch(uarmg->otyp) {
    case 0x8f:
    case 0x92:
      break;
    case 0x90:
      otyp = otyp + -3;
      break;
    case 0x91:
      otyp = otyp + -2;
      break;
    default:
      warning("Unknown type of gloves (%d)",(ulong)(uint)(int)uarmg->otyp);
    }
  }
  iVar5 = omon_adj(mon,obj,'\x01');
  otyp = iVar5 + otyp;
  if ((mon->data->mflags2 & 0x80) != 0) {
    if (u.umonnum == u.umonster) {
      if (urace.malenum == 0x111) goto LAB_001af55c;
    }
    else if (((youmonst.data)->mflags2 & 0x10) != 0) {
LAB_001af55c:
      otyp = otyp + 1;
    }
  }
  if (bVar12 && bVar13) {
    otyp = otyp + 1000;
  }
  if (((obj->oclass == '\r') && (mon->data->mlet == '\x15')) &&
     ((mon->data->mflags2 & 0x20000000) != 0)) {
    if (mon->mtame != '\0') {
      pcVar7 = Monnam(mon);
      pcVar8 = xname(obj);
      pcVar8 = the(pcVar8);
      pline("%s catches and drops %s.",pcVar7,pcVar8);
      return 0;
    }
    pcVar7 = Monnam(mon);
    pcVar8 = xname(obj);
    pcVar8 = the(pcVar8);
    pline("%s catches %s.",pcVar7,pcVar8);
    iVar4 = gem_accept(mon,obj);
    return iVar4;
  }
  if (((obj->oartifact != '\0') && (bVar2 = is_quest_artifact(obj), bVar2 != '\0')) &&
     (mon->data->msound == '\x1f')) {
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfff7ffff;
    mon->mstrategy = mon->mstrategy & 0xcfffffff;
    if ((*(uint *)&mon->field_0x60 >> 0x12 & 1) != 0) {
      pcVar7 = Monnam(mon);
      pcVar8 = xname(obj);
      pcVar8 = the(pcVar8);
      pline("%s catches %s.",pcVar7,pcVar8);
      if ((*(uint *)&mon->field_0x60 >> 0x16 & 1) == 0) {
        mpickobj(mon,obj);
      }
      else {
        bVar2 = monnear(mon,(int)u.ux,(int)u.uy);
        finish_quest(obj);
        pcVar7 = Monnam(mon);
        pcVar8 = "tosses";
        if (bVar2 != '\0') {
          pcVar8 = "hands";
        }
        pcVar9 = xname(obj);
        pcVar9 = the(pcVar9);
        pline("%s %s %s back to you.",pcVar7,pcVar8,pcVar9);
        if (bVar2 == '\0') {
          iVar4 = sgn((int)mon->mx - (int)u.ux);
          iVar5 = sgn((int)mon->my - (int)u.uy);
          sho_obj_return_to_u(obj,(schar)iVar4,(schar)iVar5);
        }
        addinv(obj);
        encumber_msg();
      }
      return 1;
    }
    return 0;
  }
  if (((obj->oclass == '\x02') ||
      ((obj->oclass == '\x06' && (objects[obj->otyp].oc_subtyp != '\0')))) || (obj->oclass == '\r'))
  {
    if (((obj->oclass == '\x02') || (obj->oclass == '\r')) &&
       ((-0x19 < objects[obj->otyp].oc_subtyp && (objects[obj->otyp].oc_subtyp < -0x15)))) {
      if (((((obj->oclass == '\x02') || (obj->oclass == '\r')) &&
           (-0x19 < objects[obj->otyp].oc_subtyp)) &&
          ((objects[obj->otyp].oc_subtyp < -0x15 && (uwep != (obj *)0x0)))) &&
         ((int)objects[obj->otyp].oc_subtyp == -(int)objects[uwep->otyp].oc_subtyp)) {
        cVar1 = uwep->spe;
        if ((*(uint *)&uwep->field_0x4a >> 10 & 3) < (*(uint *)&uwep->field_0x4a >> 8 & 3)) {
          local_90 = *(uint *)&uwep->field_0x4a >> 8;
        }
        else {
          local_90 = *(uint *)&uwep->field_0x4a >> 10;
        }
        local_90 = local_90 & 3;
        iVar5 = weapon_hit_bonus(uwep);
        otyp = iVar5 + ((int)cVar1 - local_90) + otyp;
        if (uwep->oartifact != '\0') {
          iVar5 = spec_abon(uwep,mon);
          otyp = iVar5 + otyp;
        }
        iVar5 = otyp;
        if ((((urace.malenum == 0x111) || (urole.malenum == 0x165)) &&
            ((u.umonnum == u.umonster || (((youmonst.data)->mflags2 & (int)urace.selfmask) != 0))))
           && (objects[uwep->otyp].oc_subtyp == '\x16')) {
          if ((urace.malenum == 0x111) && (uwep->otyp == 0x43)) {
            iVar5 = otyp + 2;
          }
          else {
            iVar5 = otyp + 1;
            if ((urole.malenum == 0x165) && (uwep->otyp == 0x45)) {
              iVar5 = otyp + 2;
            }
          }
        }
      }
      else {
        iVar5 = otyp + -4;
      }
    }
    else {
      if (iVar4 == 9) {
        otyp = otyp + 4;
      }
      else {
        bVar2 = throwing_weapon(obj);
        if (bVar2 == '\0') {
          otyp = otyp + -2;
        }
        else {
          otyp = otyp + 2;
        }
      }
      iVar5 = weapon_hit_bonus(obj);
      iVar5 = iVar5 + otyp;
    }
    otyp = iVar5;
    iVar5 = rnd(0x14);
    if (otyp < iVar5) {
      tmiss(obj,mon);
    }
    else {
      was_swallowed = 0;
      bVar2 = hmon(mon,obj,ostack,'\x01');
      if (bVar2 != '\0') {
        cutworm(mon,bhitpos.x,bhitpos.y,obj);
      }
      exercise(3,'\x01');
      bVar2 = detonate_obj(obj,ostack,uwep,(int)bhitpos.x,(int)bhitpos.y,'\x01');
      if (bVar2 != '\0') {
        return 1;
      }
      if ((((objects[iVar4].oc_subtyp < '\0') && (-0x1b < objects[iVar4].oc_subtyp)) &&
          (objects[iVar4].oc_subtyp != -0x1a)) &&
         (((objects[iVar4].oc_subtyp != -0x18 || (iVar5 = rn2(2), iVar5 != 0)) &&
          (((byte)objects[iVar4].field_0x10 >> 4 & 1) == 0)))) {
        if ((*(uint *)&obj->field_0x4a >> 10 & 3) < (*(uint *)&obj->field_0x4a >> 8 & 3)) {
          local_98 = *(uint *)&obj->field_0x4a >> 8;
        }
        else {
          local_98 = *(uint *)&obj->field_0x4a >> 10;
        }
        local_98 = local_98 & 3;
        iVar4 = (local_98 + 3) - (int)obj->spe;
        if (iVar4 < 2) {
          iVar4 = rn2(4);
          was_swallowed = (int)((iVar4 != 0 ^ 0xffU) & 1);
        }
        else {
          was_swallowed = rn2(iVar4);
        }
        if (((*(uint *)&obj->field_0x4a >> 1 & 1) != 0) && (iVar4 = rnl(4), iVar4 == 0)) {
          was_swallowed = 0;
        }
      }
      if ((was_swallowed != 0) || (bVar14)) {
        if (u.ushops[0] != '\0') {
          check_shop_obj(obj,bhitpos.x,bhitpos.y,'\x01');
        }
        obfree(obj,(obj *)0x0);
        return 1;
      }
      passive_obj(mon,obj,(attack *)0x0);
    }
  }
  else if (iVar4 == 0x216) {
    exercise(0,'\x01');
    iVar4 = rnd(0x14);
    if (otyp < iVar4) {
      tmiss(obj,mon);
    }
    else {
      exercise(3,'\x01');
      bVar2 = hmon(mon,obj,ostack,'\x01');
      if (((bVar2 == '\0') && (local_49)) && (((u._1052_1_ & 1) == 0 && (obj == uball)))) {
        return 1;
      }
      if (bVar14) {
        if (u.ushops[0] != '\0') {
          check_shop_obj(obj,bhitpos.x,bhitpos.y,'\x01');
        }
        obfree(obj,(obj *)0x0);
        return 1;
      }
    }
  }
  else if (iVar4 == 0x214) {
    exercise(0,'\x01');
    iVar4 = rnd(0x14);
    if (otyp < iVar4) {
      tmiss(obj,mon);
    }
    else {
      exercise(3,'\x01');
      hmon(mon,obj,ostack,'\x01');
      if (bVar14) {
        if (u.ushops[0] != '\0') {
          check_shop_obj(obj,bhitpos.x,bhitpos.y,'\x01');
        }
        obfree(obj,(obj *)0x0);
        return 1;
      }
    }
  }
  else {
    if ((((iVar4 == 0x10f) || (iVar4 == 0x120)) || (iVar4 == 0x218)) || (iVar4 == 0x219)) {
      if (bVar12 && bVar13) {
LAB_001b0070:
        hmon(mon,obj,ostack,'\x01');
        return 1;
      }
      sVar3 = acurr(3);
      iVar4 = rnd(0x19);
      if (iVar4 < sVar3) goto LAB_001b0070;
    }
    if (obj->oclass == '\b') {
      if (bVar12 && bVar13) {
LAB_001b00d1:
        potionhit(mon,obj,'\x01');
        return 1;
      }
      sVar3 = acurr(3);
      iVar4 = rnd(0x19);
      if (iVar4 < sVar3) goto LAB_001b00d1;
    }
    if ((((obj->oclass == '\a') &&
         (((mon->data->mflags2 & 0x400000) != 0 ||
          ((urole.malenum == 0x15d &&
           (((mon->data == mons + 0x5a || (mon->data == mons + 0x5b)) ||
            ((mon->data == mons + 0x5c || ((mon->data == mons + 0x5e || (mon->data == mons + 0x5f)))
             ))))))))) || ((mon->mtame != '\0' && (iVar4 = dogfood(mon,obj), iVar4 < 3)))) ||
       ((obj->oclass == '\a' &&
        ((((urole.malenum == 0x164 && (mon->data == mons + 0xef)) &&
          ((obj->otyp == 0x11a || (iVar4 = rn2(2), iVar4 == 0)))) ||
         (((urole.malenum == 0x166 && ((mon->data == mons + 0x156 || (mon->data == mons + 0x152))))
          || (((urole.malenum == 0x163 || (urole.malenum == 0x15b)) && (mon->data == mons + 0x19))))
         )))))) {
      pmVar10 = tamedog(mon,obj);
      if (pmVar10 != (monst *)0x0) {
        return 1;
      }
      pcVar7 = xname(obj);
      miss(pcVar7,mon);
      *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfff7ffff;
      mon->mstrategy = mon->mstrategy & 0xcfffffff;
    }
    else if (bVar12 && bVar13) {
      wakeup(mon);
      if ((obj->otyp == 0x10e) &&
         ((((((long)obj->corpsenm & 0x3ffffffffffffffU) == 0xc ||
            (((long)obj->corpsenm & 0x3ffffffffffffffU) == 0xb)) &&
           (((u.ustuck)->data->mflags1 & 0x40000) != 0)) &&
          (minstapetrify(u.ustuck,'\x01'), (u._1052_1_ & 1) == 0)))) {
        delobj(obj);
        return 1;
      }
      pcVar7 = Tobjnam(obj,"vanish");
      pcVar8 = mon_nam(mon);
      pcVar8 = s_suffix(pcVar8);
      pcVar9 = "currents";
      if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
        pcVar9 = "entrails";
      }
      pline("%s into %s %s.",pcVar7,pcVar8,pcVar9);
    }
    else {
      tmiss(obj,mon);
    }
  }
  return 0;
}

Assistant:

int thitmonst(struct monst *mon, struct obj *obj, struct obj *ostack)
{
	int	tmp; /* Base chance to hit */
	int	disttmp; /* distance modifier */
	int otyp = obj->otyp;
	boolean guaranteed_hit = (u.uswallow && mon == u.ustuck);
	boolean obj_disint = (touch_disintegrates(mon->data) &&
			      !mon->mcan &&
			      (mon->mhp > 1) &&
			      !oresist_disintegration(obj));

	/* Differences from melee weapons:
	 *
	 * Dex still gives a bonus, but strength does not.
	 * Polymorphed players lacking attacks may still throw.
	 * There's a base -1 to hit.
	 * No bonuses for fleeing or stunned targets (they don't dodge
	 *    melee blows as readily, but dodging arrows is hard anyway).
	 * Not affected by traps, etc.
	 * Certain items which don't in themselves do damage ignore tmp.
	 * Distance and monster size affect chance to hit.
	 */
	tmp = -1 + Luck / 3 + find_mac(mon) + u.uhitinc +
			maybe_polyd(youmonst.data->mlevel, u.ulevel);
	if (ACURR(A_DEX) < 4) tmp -= 3;
	else if (ACURR(A_DEX) < 6) tmp -= 2;
	else if (ACURR(A_DEX) < 8) tmp -= 1;
	else if (ACURR(A_DEX) >= 14) tmp += (ACURR(A_DEX) - 14);

	/* Modify to-hit depending on distance; but keep it sane.
	 * Polearms get a distance penalty even when wielded; it's
	 * hard to hit at a distance.
	 */
	disttmp = 3 - distmin(u.ux, u.uy, mon->mx, mon->my);
	if (disttmp < -4) disttmp = -4;
	tmp += disttmp;

	/* gloves are a hinderance to proper use of bows */
	if (uarmg && uwep && objects[uwep->otyp].oc_skill == P_BOW) {
	    switch (uarmg->otyp) {
	    case GAUNTLETS_OF_POWER:    /* metal */
		tmp -= 2;
		break;
	    case GAUNTLETS_OF_FUMBLING:
		tmp -= 3;
		break;
	    case LEATHER_GLOVES:
	    case GAUNTLETS_OF_DEXTERITY:
		break;
	    default:
		warning("Unknown type of gloves (%d)", uarmg->otyp);
		break;
	    }
	}

	tmp += omon_adj(mon, obj, TRUE);
	if (is_orc(mon->data) && maybe_polyd(is_elf(youmonst.data),
			Race_if (PM_ELF)))
	    tmp++;
	if (guaranteed_hit) {
	    tmp += 1000; /* Guaranteed hit */
	}

	if (obj->oclass == GEM_CLASS && is_unicorn(mon->data)) {
	    if (mon->mtame) {
		pline("%s catches and drops %s.", Monnam(mon), the(xname(obj)));
		return 0;
	    } else {
		pline("%s catches %s.", Monnam(mon), the(xname(obj)));
		return gem_accept(mon, obj);
	    }
	}

	/* don't make game unwinnable if naive player throws artifact
	   at leader.... */
	if (quest_arti_hits_leader(obj, mon)) {
	    /* not wakeup(), which angers non-tame monsters */
	    mon->msleeping = 0;
	    mon->mstrategy &= ~STRAT_WAITMASK;

	    if (mon->mcanmove) {
		pline("%s catches %s.", Monnam(mon), the(xname(obj)));
		if (mon->mpeaceful) {
		    boolean next2u = monnear(mon, u.ux, u.uy);

		    finish_quest(obj);	/* acknowledge quest completion */
		    pline("%s %s %s back to you.", Monnam(mon),
			  (next2u ? "hands" : "tosses"), the(xname(obj)));
		    if (!next2u) {
			schar dx = sgn(mon->mx - u.ux);
			schar dy = sgn(mon->my - u.uy);
			sho_obj_return_to_u(obj, dx, dy);
		    }
		    addinv(obj);	/* back into your inventory */
		    encumber_msg();
		} else {
		    /* angry leader caught it and isn't returning it */
		    mpickobj(mon, obj);
		}
		return 1;		/* caller doesn't need to place it */
	    }
	    return 0;
	}

	if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
		obj->oclass == GEM_CLASS) {
	    if (is_ammo(obj)) {
		if (!ammo_and_launcher(obj, uwep)) {
		    tmp -= 4;
		} else {
		    tmp += uwep->spe - greatest_erosion(uwep);
		    tmp += weapon_hit_bonus(uwep);
		    if (uwep->oartifact) tmp += spec_abon(uwep, mon);
		    /*
		     * Elves and Samurais are highly trained w/bows,
		     * especially their own special types of bow.
		     * Polymorphing won't make you a bow expert.
		     */
		    if ((Race_if (PM_ELF) || Role_if(PM_SAMURAI)) &&
				(!Upolyd || your_race(youmonst.data)) &&
				objects[uwep->otyp].oc_skill == P_BOW) {
			tmp++;
			if (Race_if (PM_ELF) && uwep->otyp == ELVEN_BOW)
			    tmp++;
			else if (Role_if (PM_SAMURAI) && uwep->otyp == YUMI)
			    tmp++;
		    }
		}
	    } else {
		if (otyp == BOOMERANG)		/* arbitrary */
		    tmp += 4;
		else if (throwing_weapon(obj))	/* meant to be thrown */
		    tmp += 2;
		else				/* not meant to be thrown */
		    tmp -= 2;
		/* we know we're dealing with a weapon or weptool handled
		   by WEAPON_SKILLS once ammo objects have been excluded */
		tmp += weapon_hit_bonus(obj);
	    }

	    if (tmp >= rnd(20)) {
		int broken = FALSE;
		if (hmon(mon, obj, ostack, TRUE)) {	/* mon still alive */
		    cutworm(mon, bhitpos.x, bhitpos.y, obj);
		}
		exercise(A_DEX, TRUE);
		if (detonate_obj(obj, ostack, uwep, bhitpos.x, bhitpos.y, TRUE))
		    return 1;
		/* projectiles other than shuriken, crossbow bolts (half the
		   time) and magic stones sometimes disappear when thrown */
		if (objects[otyp].oc_skill < P_NONE &&
				objects[otyp].oc_skill > -P_BOOMERANG &&
				objects[otyp].oc_skill != -P_SHURIKEN &&
				!(objects[otyp].oc_skill == -P_CROSSBOW && !rn2(2)) &&
				!objects[otyp].oc_magic) {
		    /* we were breaking 2/3 of everything unconditionally.
		     * we still don't want anything to survive unconditionally,
		     * but we need ammo to stay around longer on average.
		     */
		    int chance;
		    chance = 3 + greatest_erosion(obj) - obj->spe;
		    if (chance > 1)
			broken = rn2(chance);
		    else
			broken = !rn2(4);
		    if (obj->blessed && !rnl(4))
			broken = 0;
		}
		if (broken || obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
		passive_obj(mon, obj, NULL);
	    } else {
		tmiss(obj, mon);
	    }

	} else if (otyp == HEAVY_IRON_BALL) {
	    exercise(A_STR, TRUE);
	    if (tmp >= rnd(20)) {
		int was_swallowed = guaranteed_hit;

		exercise(A_DEX, TRUE);
		if (!hmon(mon, obj, ostack, TRUE)) {	/* mon killed */
		    if (was_swallowed && !u.uswallow && obj == uball)
			return 1;	/* already did placebc() */
		}

		if (obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
	    } else {
		tmiss(obj, mon);
	    }

	} else if (otyp == BOULDER) {
	    exercise(A_STR, TRUE);
	    if (tmp >= rnd(20)) {
		exercise(A_DEX, TRUE);
		hmon(mon, obj, ostack, TRUE);
		if (obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
	    } else {
		tmiss(obj, mon);
	    }

	} else if ((otyp == EGG || otyp == CREAM_PIE ||
		    otyp == BLINDING_VENOM || otyp == ACID_VENOM) &&
		(guaranteed_hit || ACURR(A_DEX) > rnd(25))) {
	    hmon(mon, obj, ostack, TRUE);
	    return 1;	/* hmon used it up */

	} else if (obj->oclass == POTION_CLASS &&
		(guaranteed_hit || ACURR(A_DEX) > rnd(25))) {
	    potionhit(mon, obj, TRUE);
	    return 1;

	} else if (befriend_with_obj(mon->data, obj) ||
		   (mon->mtame && dogfood(mon, obj) <= ACCFOOD) ||
		   (obj->oclass == FOOD_CLASS &&
		    ((Role_if(PM_ROGUE) &&
		       mon->data == &mons[PM_MONKEY] &&
		      (obj->otyp == BANANA || !rn2(2))) ||
		     (Role_if(PM_TOURIST) &&
		      (mon->data == &mons[PM_CROCODILE] ||
		       mon->data == &mons[PM_BABY_CROCODILE])) ||
		     ((Role_if(PM_RANGER) || Role_if(PM_CAVEMAN)) &&
		       mon->data == &mons[PM_WINTER_WOLF_CUB])))) {
	    if (tamedog(mon, obj))
		return 1;           	/* obj is gone */
	    else {
		/* not tmiss(), which angers non-tame monsters */
		miss(xname(obj), mon);
		mon->msleeping = 0;
		mon->mstrategy &= ~STRAT_WAITMASK;
	    }
	} else if (guaranteed_hit) {
	    /* this assumes that guaranteed_hit is due to swallowing */
	    wakeup(mon);
	    if (obj->otyp == CORPSE && touch_petrifies(&mons[obj->corpsenm])) {
		if (is_animal(u.ustuck->data)) {
			minstapetrify(u.ustuck, TRUE);
			/* Don't leave a cockatrice corpse available in a statue */
			if (!u.uswallow) {
				delobj(obj);
				return 1;
			}
	    	}
	    }
	    pline("%s into %s %s.",
		Tobjnam(obj, "vanish"), s_suffix(mon_nam(mon)),
		is_animal(u.ustuck->data) ? "entrails" : "currents");
	} else {
	    tmiss(obj, mon);
	}

	return 0;
}